

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::appendLinearJoint(btSoftBody *this,Specs *specs,btSoftBody *body)

{
  appendLinearJoint(this,specs,*(this->m_clusters).m_data,(Body)ZEXT824(*(body->m_clusters).m_data))
  ;
  return;
}

Assistant:

void			btSoftBody::appendLinearJoint(const LJoint::Specs& specs,btSoftBody* body)
{
	appendLinearJoint(specs,m_clusters[0],body->m_clusters[0]);
}